

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationVP.cpp
# Opt level: O0

bool __thiscall DIS::SeparationVP::operator==(SeparationVP *this,SeparationVP *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  SeparationVP *rhs_local;
  SeparationVP *this_local;
  
  local_19 = this->_reasonForSeparation == rhs->_reasonForSeparation &&
             this->_recordType == rhs->_recordType;
  if (this->_preEntityIndicator != rhs->_preEntityIndicator) {
    local_19 = false;
  }
  if (this->_padding1 != rhs->_padding1) {
    local_19 = false;
  }
  bVar1 = EntityID::operator==(&this->_parentEntityID,&rhs->_parentEntityID);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_padding2 != rhs->_padding2) {
    local_19 = false;
  }
  if (this->_stationLocation != rhs->_stationLocation) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool SeparationVP::operator ==(const SeparationVP& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_reasonForSeparation == rhs._reasonForSeparation) ) ivarsEqual = false;
     if( ! (_preEntityIndicator == rhs._preEntityIndicator) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_parentEntityID == rhs._parentEntityID) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;
     if( ! (_stationLocation == rhs._stationLocation) ) ivarsEqual = false;

    return ivarsEqual;
 }